

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

void __thiscall
dap::BasicTypeInfo<dap::ProgressUpdateEvent>::destruct
          (BasicTypeInfo<dap::ProgressUpdateEvent> *this,void *ptr)

{
  if (*(long **)((long)ptr + 0x38) != (long *)((long)ptr + 0x48)) {
    operator_delete(*(long **)((long)ptr + 0x38),*(long *)((long)ptr + 0x48) + 1);
  }
  if (*ptr != (long *)((long)ptr + 0x10)) {
    operator_delete(*ptr,*(long *)((long)ptr + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }